

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O0

int accept_client(void)

{
  FILE *pFVar1;
  uint16_t uVar2;
  uint __fd;
  uint uVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  undefined1 local_b0 [8];
  sigset_t none;
  socklen_t sz;
  sockaddr_in in;
  pid_t pid;
  int rc;
  int sc;
  int n;
  int fd;
  
  in.sin_zero[4] = 0xff;
  in.sin_zero[5] = 0xff;
  in.sin_zero[6] = 0xff;
  in.sin_zero[7] = 0xff;
  none.__val[0xf]._0_4_ = 0x10;
  __fd = accept(cfg.listener_fd,(sockaddr *)((long)none.__val + 0x7c),
                (socklen_t *)(none.__val + 0xf));
  pFVar1 = _stderr;
  if (__fd == 0xffffffff) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(pFVar1,"accept: %s\n",pcVar6);
  }
  else {
    if ((cfg.verbose != 0) && ((int)none.__val[0xf] == 0x10)) {
      pcVar6 = inet_ntoa((in_addr)sz);
      uVar2 = ntohs(none.__val[0xf]._6_2_);
      fprintf(pFVar1,"connection fd %d from %s:%d\n",(ulong)__fd,pcVar6,(ulong)uVar2);
    }
    uVar3 = fork();
    pFVar1 = _stderr;
    if (uVar3 == 0xffffffff) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar1,"fork: %s\n",pcVar6);
    }
    else if ((int)uVar3 < 1) {
      if (uVar3 != 0) {
        __assert_fail("pid == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/onconnect.c"
                      ,0x9f,"int accept_client()");
      }
      close(cfg.listener_fd);
      close(cfg.signal_fd);
      close(cfg.epoll_fd);
      if (__fd != 3) {
        iVar4 = dup2(__fd,3);
        pFVar1 = _stderr;
        if (iVar4 < 0) {
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          fprintf(pFVar1,"dup2: %s\n",pcVar6);
          return -1;
        }
        close(__fd);
      }
      for (rc = 0; (uint)rc < 7; rc = rc + 1) {
        signal(sigs[rc],(__sighandler_t)0x0);
      }
      sigemptyset((sigset_t *)local_b0);
      sigprocmask(2,(sigset_t *)local_b0,(sigset_t *)0x0);
      iVar4 = execv(*cfg.subprocess_argv,cfg.subprocess_argv);
      pFVar1 = _stderr;
      if (iVar4 != -1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/onconnect.c"
                      ,0xc0,"int accept_client()");
      }
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar1,"execv: %s\n",pcVar6);
    }
    else {
      close(__fd);
      fprintf(_stderr,"forked pid %d\n",(ulong)uVar3);
      in.sin_zero[4] = '\0';
      in.sin_zero[5] = '\0';
      in.sin_zero[6] = '\0';
      in.sin_zero[7] = '\0';
    }
  }
  iVar4._0_1_ = in.sin_zero[4];
  iVar4._1_1_ = in.sin_zero[5];
  iVar4._2_1_ = in.sin_zero[6];
  iVar4._3_1_ = in.sin_zero[7];
  return iVar4;
}

Assistant:

int accept_client() {
  int fd, n, sc, rc = -1;
  pid_t pid;
  struct sockaddr_in in;
  socklen_t sz = sizeof(in);

  fd = accept(cfg.listener_fd,(struct sockaddr*)&in, &sz);
  if (fd == -1) {
    fprintf(stderr,"accept: %s\n", strerror(errno)); 
    goto done;
  }

  if (cfg.verbose && (sizeof(in)==sz)) {
    fprintf(stderr,"connection fd %d from %s:%d\n", fd,
    inet_ntoa(in.sin_addr), (int)ntohs(in.sin_port));
  }

  /* fork subprocess */
  pid = fork();

  if (pid == -1) {
    fprintf(stderr, "fork: %s\n", strerror(errno));
    goto done;
  }

  if (pid > 0) { /* parent */
    close(fd);
    fprintf(stderr, "forked pid %d\n", pid);
  } else {  /* child */
    assert(pid == 0);

    /* in the child, close the parent's descriptors except
     * for stdin, stdout, stderr and the new connection */
    close(cfg.listener_fd);
    close(cfg.signal_fd);
    close(cfg.epoll_fd);

    /* make the new connection fd 3, close original fd */
    if (fd != STDERR_FILENO+1) {      /* 3 */
      sc = dup2(fd, STDERR_FILENO+1);
      if (sc < 0) {
        fprintf(stderr, "dup2: %s\n", strerror(errno));
        goto done;
      }
      close(fd);
    }

    /* restore/unblock default signal handlers */
    for(n = 0; n < sizeof(sigs)/sizeof(*sigs); n++) {
      signal(sigs[n], SIG_DFL);
    }
    sigset_t none;
    sigemptyset(&none);
    sigprocmask(SIG_SETMASK, &none, NULL);

    sc = execv(cfg.subprocess_argv[0], cfg.subprocess_argv);
    if (sc == -1) {
      fprintf(stderr, "execv: %s\n", strerror(errno));
      goto done;
    }

    /* NOT REACHED */
    assert(0);
    goto done;

  }

  rc = 0;

 done:
  return rc;
}